

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char __c;
  char *pcVar1;
  int iVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  pointer result_00;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((((this->allow_extra_args_ == true) && (result->_M_string_length != 0)) &&
      (pcVar1 = (result->_M_dataplus)._M_p, *pcVar1 == '[')) &&
     (pcVar1[result->_M_string_length - 1] == ']')) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result
               ,1,0xffffffffffffffff);
    detail::split(&local_60,(string *)&local_48,',');
    ::std::__cxx11::string::~string((string *)&local_48);
    iVar4 = 0;
    for (result_00 = local_60.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        result_00 !=
        local_60.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; result_00 = (pointer)((string *)result_00 + 1))
    {
      if (((string *)result_00)->_M_string_length != 0) {
        iVar2 = _add_result(this,(string *)result_00,res);
        iVar4 = iVar4 + iVar2;
      }
    }
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
LAB_0020d1ef:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
  }
  else {
    __c = (this->super_OptionBase<CLI::Option>).delimiter_;
    if (__c != '\0') {
      iVar4 = 0;
      sVar3 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result,__c,0
                  );
      if (sVar3 != 0xffffffffffffffff) {
        detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_48,result,(this->super_OptionBase<CLI::Option>).delimiter_);
        for (; local_48._M_dataplus._M_p != (pointer)local_48._M_string_length;
            local_48._M_dataplus._M_p = local_48._M_dataplus._M_p + 0x20) {
          if (((value_type *)local_48._M_dataplus._M_p)->_M_string_length != 0) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,(value_type *)local_48._M_dataplus._M_p);
            iVar4 = iVar4 + 1;
          }
        }
        this_00 = &local_48;
        goto LAB_0020d1ef;
      }
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

CLI11_INLINE int Option::_add_result(std::string &&result, std::vector<std::string> &res) const {
    int result_count = 0;
    if(allow_extra_args_ && !result.empty() && result.front() == '[' &&
       result.back() == ']') {  // this is now a vector string likely from the default or user entry
        result.pop_back();

        for(auto &var : CLI::detail::split(result.substr(1), ',')) {
            if(!var.empty()) {
                result_count += _add_result(std::move(var), res);
            }
        }
        return result_count;
    }
    if(delimiter_ == '\0') {
        res.push_back(std::move(result));
        ++result_count;
    } else {
        if((result.find_first_of(delimiter_) != std::string::npos)) {
            for(const auto &var : CLI::detail::split(result, delimiter_)) {
                if(!var.empty()) {
                    res.push_back(var);
                    ++result_count;
                }
            }
        } else {
            res.push_back(std::move(result));
            ++result_count;
        }
    }
    return result_count;
}